

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

string * libcellml::resolvePath(string *__return_storage_ptr__,string *filename,string *base)

{
  string local_40;
  string *local_20;
  string *base_local;
  string *filename_local;
  
  local_20 = base;
  base_local = filename;
  filename_local = __return_storage_ptr__;
  pathFromUrl(&local_40,base);
  std::operator+(__return_storage_ptr__,&local_40,base_local);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string resolvePath(const std::string &filename, const std::string &base)
{
    return pathFromUrl(base) + filename;
}